

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::load_sequence_groups_files(HL1MDLLoader *this)

{
  int iVar1;
  long lVar2;
  uchar **ppuVar3;
  SequenceHeader_HL1 **ppSVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  int i;
  long lVar8;
  ulong *puVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  string sequence_file_path;
  string file_path_without_extension;
  stringstream ss;
  string local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  iVar1 = this->header_->numseqgroups;
  if ((long)iVar1 < 2) {
    return;
  }
  this->num_sequence_groups_ = iVar1;
  uVar11 = (long)iVar1 << 3;
  ppuVar3 = (uchar **)operator_new__(uVar11);
  this->anim_buffers_ = ppuVar3;
  ppSVar4 = (SequenceHeader_HL1 **)operator_new__(uVar11);
  this->anim_headers_ = ppSVar4;
  lVar8 = 0;
  do {
    this->anim_buffers_[lVar8] = (uchar *)0x0;
    this->anim_headers_[lVar8] = (SequenceHeader_HL1 *)0x0;
    lVar8 = lVar8 + 1;
  } while (lVar8 < this->num_sequence_groups_);
  DefaultIOSystem::absolutePath(&local_218,this->file_path_);
  (*this->io_->_vptr_IOSystem[3])();
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_218,local_218._M_string_length,0,'\x01');
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1a8 = *puVar9;
    lStack_1a0 = plVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar9;
    local_1b8 = (ulong *)*plVar5;
  }
  local_1b0 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DefaultIOSystem::completeBaseName(&local_1d8,this->file_path_);
  uVar11 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar11 = local_1a8;
  }
  if (uVar11 < local_1d8._M_string_length + local_1b0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      uVar10 = local_1d8.field_2._M_allocated_capacity;
    }
    if (local_1d8._M_string_length + local_1b0 <= (ulong)uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
      goto LAB_0047ab19;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8._M_dataplus._M_p);
LAB_0047ab19:
  local_1f8 = &local_1e8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_1e8 = *plVar5;
    uStack_1e0 = puVar6[3];
  }
  else {
    local_1e8 = *plVar5;
    local_1f8 = (long *)*puVar6;
  }
  local_1f0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
      &local_218.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                    local_218.field_2._M_allocated_capacity + 1);
  }
  if (1 < this->num_sequence_groups_) {
    lVar8 = 1;
    lVar12 = 8;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(char *)local_1f8,local_1f0);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8 - 0x18)) = 2;
      lVar2 = *(long *)(local_1a8 - 0x18);
      if (acStack_c8[lVar2 + 1] == '\0') {
        std::ios::widen((char)(ostream *)&local_1a8 + (char)lVar2);
        acStack_c8[lVar2 + 1] = '\x01';
      }
      acStack_c8[lVar2] = '0';
      std::ostream::operator<<((ostream *)&local_1a8,(int)lVar8);
      local_218._M_dataplus._M_p._0_1_ = 0x2e;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,(char *)&local_218,1);
      BaseImporter::GetExtension(&local_218,this->file_path_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,(char *)CONCAT71(local_218._M_dataplus._M_p._1_7_,
                                         local_218._M_dataplus._M_p._0_1_),
                 local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
          &local_218.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                        local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
                (this,&local_218,(uchar **)((long)this->anim_buffers_ + lVar12));
      this->anim_headers_[lVar8] = (SequenceHeader_HL1 *)this->anim_buffers_[lVar8];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
          &local_218.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                        local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar8 = lVar8 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar8 < this->num_sequence_groups_);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  return;
}

Assistant:

void HL1MDLLoader::load_sequence_groups_files() {
    if (header_->numseqgroups <= 1)
        return;

    num_sequence_groups_ = header_->numseqgroups;

    anim_buffers_ = new unsigned char *[num_sequence_groups_];
    anim_headers_ = new SequenceHeader_HL1 *[num_sequence_groups_];
    for (int i = 0; i < num_sequence_groups_; ++i) {
        anim_buffers_[i] = NULL;
        anim_headers_[i] = NULL;
    }

    std::string file_path_without_extension =
            DefaultIOSystem::absolutePath(file_path_) +
            io_->getOsSeparator() +
            DefaultIOSystem::completeBaseName(file_path_);

    for (int i = 1; i < num_sequence_groups_; ++i) {
        std::stringstream ss;
        ss << file_path_without_extension;
        ss << std::setw(2) << std::setfill('0') << i;
        ss << '.' << BaseImporter::GetExtension(file_path_);

        std::string sequence_file_path = ss.str();

        load_file_into_buffer<SequenceHeader_HL1>(sequence_file_path, anim_buffers_[i]);

        anim_headers_[i] = (SequenceHeader_HL1 *)anim_buffers_[i];
    }
}